

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

int If_CutPerformCheck07(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  word wVar2;
  int iVar3;
  int iVar;
  bool bVar4;
  word local_38;
  undefined8 uStack_30;
  
  iVar3 = 0;
  iVar = 0;
  if (0 < nLeaves) {
    iVar3 = nLeaves;
    iVar = 0;
  }
  do {
    if (iVar3 == iVar) {
      bVar4 = true;
      if (4 < nLeaves) {
        if (nLeaves == 7) {
          local_38 = *(word *)pTruth;
          uStack_30 = *(undefined8 *)(pTruth + 2);
          wVar2 = If_Dec7Perform(&local_38,0);
        }
        else if (nLeaves == 6) {
          wVar2 = If_Dec6Perform(*(word *)pTruth,0);
        }
        else {
          if (nLeaves != 5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                          ,0x45b,
                          "int If_CutPerformCheck07(If_Man_t *, unsigned int *, int, int, char *)");
          }
          wVar2 = If_Dec5Perform(CONCAT44(*pTruth,*pTruth),0);
        }
        bVar4 = wVar2 != 0;
      }
      goto LAB_00378262;
    }
    iVar1 = Abc_TtHasVar((word *)pTruth,nVars,iVar);
    iVar = iVar + 1;
  } while (iVar1 != 0);
  bVar4 = false;
LAB_00378262:
  return (int)bVar4;
}

Assistant:

int If_CutPerformCheck07( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    int fDerive = 0;
    int v;
    // skip non-support minimal
    for ( v = 0; v < nLeaves; v++ )
        if ( !Abc_TtHasVar( (word *)pTruth, nVars, v ) )
            return 0;
    // check
    if ( nLeaves < 5 )
        return 1;
    if ( nLeaves == 5 )
    {
        word z, t = ((word)pTruth[0] << 32) | (word)pTruth[0];
        z = If_Dec5Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec6Verify( t, z );
        return z != 0;
    }
    if ( nLeaves == 6 )
    {
        word z, t = ((word *)pTruth)[0];
        z = If_Dec6Perform( t, fDerive );
        if ( fDerive && z )
        {
//            If_DecPrintConfig( z );
            If_Dec6Verify( t, z );
        }
//        if ( z == 0 )
//            Extra_PrintHex(stdout, (unsigned *)&t, 6), printf( "  " ), Kit_DsdPrintFromTruth( (unsigned *)&t, 6 ), printf( "\n" );
        return z != 0;
    }
    if ( nLeaves == 7 )
    {
        word z, t[2];
        t[0] = ((word *)pTruth)[0];
        t[1] = ((word *)pTruth)[1];
//        if ( If_Dec7CheckMux(t) >= 0 )
//            return 1;
        z = If_Dec7Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec7Verify( t, z );
        return z != 0;
    }
    assert( 0 );
    return 0;
}